

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

uint secp256k1_scalar_get_bits_var(secp256k1_scalar *a,uint offset,uint count)

{
  uint in_EDX;
  uint in_ESI;
  secp256k1_scalar *in_RDI;
  uint local_4;
  
  if ((in_ESI + in_EDX) - 1 >> 6 == in_ESI >> 6) {
    local_4 = secp256k1_scalar_get_bits(in_RDI,in_ESI,in_EDX);
  }
  else {
    local_4 = ((uint)(in_RDI->d[in_ESI >> 6] >> ((byte)in_ESI & 0x3f)) |
              (uint)(in_RDI->d[(in_ESI >> 6) + 1] << (0x40 - ((byte)in_ESI & 0x3f) & 0x3f))) &
              (int)(1L << ((byte)in_EDX & 0x3f)) - 1U;
  }
  return local_4;
}

Assistant:

SECP256K1_INLINE static unsigned int secp256k1_scalar_get_bits_var(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    VERIFY_CHECK(count < 32);
    VERIFY_CHECK(offset + count <= 256);
    if ((offset + count - 1) >> 6 == offset >> 6) {
        return secp256k1_scalar_get_bits(a, offset, count);
    } else {
        VERIFY_CHECK((offset >> 6) + 1 < 4);
        return ((a->d[offset >> 6] >> (offset & 0x3F)) | (a->d[(offset >> 6) + 1] << (64 - (offset & 0x3F)))) & ((((uint64_t)1) << count) - 1);
    }
}